

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O1

void interpolatetest(void)

{
  double dVar1;
  double dStack_88;
  double tablei [6];
  double tablet [6];
  double ylo;
  double yhi;
  
  dStack_88 = -4.38;
  tablei[0] = -4.15;
  tablei[1] = -4.04;
  tablei[2] = -3.99;
  tablei[3] = -3.98;
  tablei[4] = -3.96;
  tablei[5] = 25.0;
  tablet[0] = 50.0;
  tablet[1] = 100.0;
  tablet[2] = 250.0;
  tablet[3] = 500.0;
  tablet[4] = 100000.0;
  arrayminmax(&dStack_88,6,tablet + 5,&ylo);
  dVar1 = interpolate_linear(tablei + 5,&dStack_88,6,2000.0);
  printf("OUT %g \n",SUB84(dVar1,0));
  return;
}

Assistant:

void interpolatetest() {
	int N;
	double ylo,yhi,val,out;

	double tablei[6] = { -4.38, -4.15, -4.04, -3.99, -3.98, -3.96};
	double tablet[6] = {25, 50, 100, 250, 500, 100000};

	val = 2000;
	N = 6;

	arrayminmax(tablei,N,&ylo,&yhi);


	out = interpolate_linear(tablet,tablei,N,val);

	printf("OUT %g \n",out);


}